

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall glslang::TFunction::addThisParameter(TFunction *this,TType *type,char *name)

{
  TType *pTVar1;
  __normal_iterator<glslang::TParameter_*,_std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>_>
  local_48;
  const_iterator local_40;
  undefined1 local_38 [8];
  TParameter p;
  char *name_local;
  TType *type_local;
  TFunction *this_local;
  
  pTVar1 = type;
  p.defaultValue = (TIntermTyped *)name;
  local_38 = (undefined1  [8])NewPoolTString_abi_cxx11_(name);
  pTVar1 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar1);
  TType::TType(pTVar1,EbtVoid,EvqTemporary,1,0,0,false);
  p.type = (TType *)0x0;
  p.name = (TString *)pTVar1;
  TType::shallowCopy(pTVar1,type);
  local_48._M_current =
       (TParameter *)
       std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::begin
                 (&(this->parameters).
                   super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>)
  ;
  __gnu_cxx::
  __normal_iterator<glslang::TParameter_const*,std::vector<glslang::TParameter,glslang::pool_allocator<glslang::TParameter>>>
  ::__normal_iterator<glslang::TParameter*>
            ((__normal_iterator<glslang::TParameter_const*,std::vector<glslang::TParameter,glslang::pool_allocator<glslang::TParameter>>>
              *)&local_40,&local_48);
  std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::insert
            (&(this->parameters).
              super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>,
             local_40,(value_type *)local_38);
  return;
}

Assistant:

virtual void addThisParameter(TType& type, const char* name)
    {
        TParameter p = { NewPoolTString(name), new TType, nullptr };
        p.type->shallowCopy(type);
        parameters.insert(parameters.begin(), p);
    }